

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_dense.c
# Opt level: O0

SUNLinearSolver SUNLinSol_Dense(N_Vector y,SUNMatrix A,SUNContext sunctx)

{
  sunindextype sVar1;
  SUNLinearSolver p_Var2;
  sunindextype *psVar3;
  void *pvVar4;
  undefined8 in_RDX;
  SUNMatrix in_RSI;
  sunindextype MatrixRows;
  SUNLinearSolverContent_Dense content;
  SUNLinearSolver S;
  SUNContext sunctx_local_scope_;
  
  sVar1 = SUNDenseMatrix_Rows(in_RSI);
  p_Var2 = (SUNLinearSolver)SUNLinSolNewEmpty(in_RDX);
  p_Var2->ops->gettype = SUNLinSolGetType_Dense;
  p_Var2->ops->getid = SUNLinSolGetID_Dense;
  p_Var2->ops->initialize = SUNLinSolInitialize_Dense;
  p_Var2->ops->setup = SUNLinSolSetup_Dense;
  p_Var2->ops->solve = SUNLinSolSolve_Dense;
  p_Var2->ops->lastflag = SUNLinSolLastFlag_Dense;
  p_Var2->ops->space = SUNLinSolSpace_Dense;
  p_Var2->ops->free = SUNLinSolFree_Dense;
  psVar3 = (sunindextype *)malloc(0x18);
  p_Var2->content = psVar3;
  *psVar3 = sVar1;
  psVar3[2] = 0;
  psVar3[1] = 0;
  pvVar4 = malloc(sVar1 << 3);
  psVar3[1] = (sunindextype)pvVar4;
  return p_Var2;
}

Assistant:

SUNLinearSolver SUNLinSol_Dense(SUNDIALS_MAYBE_UNUSED N_Vector y, SUNMatrix A,
                                SUNContext sunctx)
{
  SUNFunctionBegin(sunctx);
  SUNLinearSolver S;
  SUNLinearSolverContent_Dense content;
  sunindextype MatrixRows;

  SUNAssertNull(SUNMatGetID(A) == SUNMATRIX_DENSE, SUN_ERR_ARG_WRONGTYPE);
  SUNAssertNull(SUNDenseMatrix_Rows(A) == SUNDenseMatrix_Columns(A),
                SUN_ERR_ARG_DIMSMISMATCH);
  SUNAssertNull(y->ops->nvgetarraypointer, SUN_ERR_ARG_INCOMPATIBLE);

  MatrixRows = SUNDenseMatrix_Rows(A);
  SUNAssertNull(MatrixRows == N_VGetLength(y), SUN_ERR_ARG_DIMSMISMATCH);

  /* Create an empty linear solver */
  S = NULL;
  S = SUNLinSolNewEmpty(sunctx);
  SUNCheckLastErrNull();

  /* Attach operations */
  S->ops->gettype    = SUNLinSolGetType_Dense;
  S->ops->getid      = SUNLinSolGetID_Dense;
  S->ops->initialize = SUNLinSolInitialize_Dense;
  S->ops->setup      = SUNLinSolSetup_Dense;
  S->ops->solve      = SUNLinSolSolve_Dense;
  S->ops->lastflag   = SUNLinSolLastFlag_Dense;
  S->ops->space      = SUNLinSolSpace_Dense;
  S->ops->free       = SUNLinSolFree_Dense;

  /* Create content */
  content = NULL;
  content = (SUNLinearSolverContent_Dense)malloc(sizeof *content);
  SUNAssertNull(content, SUN_ERR_MALLOC_FAIL);

  /* Attach content */
  S->content = content;

  /* Fill content */
  content->N         = MatrixRows;
  content->last_flag = 0;
  content->pivots    = NULL;

  /* Allocate content */
  content->pivots = (sunindextype*)malloc(MatrixRows * sizeof(sunindextype));
  SUNAssertNull(content->pivots, SUN_ERR_MALLOC_FAIL);

  return (S);
}